

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
* __thiscall
args::Group::GetDescription_abi_cxx11_
          (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           *__return_storage_ptr__,Group *this,HelpParams *params,uint indent)

{
  Options OVar1;
  ulong uVar2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_00;
  reference ppBVar3;
  iterator iVar4;
  move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>
  __last;
  bool bVar5;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_88;
  const_iterator local_80;
  undefined1 local_78 [8];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  groupDescriptions;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  uint local_2c;
  uint addindent;
  HelpParams *pHStack_20;
  uint indent_local;
  HelpParams *params_local;
  Group *this_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *descriptions;
  
  addindent = indent;
  pHStack_20 = params;
  params_local = (HelpParams *)this;
  this_local = (Group *)__return_storage_ptr__;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(__return_storage_ptr__);
  uVar2 = std::__cxx11::string::empty();
  bVar5 = (uVar2 & 1) == 0;
  if (bVar5) {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::__cxx11::string_const&,char_const(&)[1],unsigned_int_const&>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                *)__return_storage_ptr__,&(this->super_Base).help,(char (*) [1])0x20a367,&addindent)
    ;
  }
  local_2c = (uint)bVar5;
  this_00 = Children(this);
  __end2 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_00);
  child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_00);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                     *)&child), bVar5) {
    ppBVar3 = __gnu_cxx::
              __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&__end2);
    groupDescriptions.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppBVar3;
    OVar1 = Base::GetOptions((Base *)groupDescriptions.
                                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    OVar1 = operator&(OVar1,HiddenFromDescription);
    if (OVar1 == None) {
      (**(code **)(*(long *)&((groupDescriptions.
                               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             ).
                             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  + 0x20))
                (local_78,groupDescriptions.
                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pHStack_20,
                 addindent + local_2c);
      local_88._M_current =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)std::
              end<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                        (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>const*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
      ::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*>
                ((__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>const*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                  *)&local_80,&local_88);
      iVar4 = std::
              begin<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                        ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_78);
      __first = std::
                make_move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>
                          ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                            )iVar4._M_current);
      iVar4 = std::
              end<std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>
                        ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_78);
      __last = std::
               make_move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>
                         ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                           )iVar4._M_current);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
      ::
      insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>*,std::vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>>>,void>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,unsigned_int>>>
                  *)__return_storage_ptr__,local_80,__first,__last);
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)local_78);
    }
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::tuple<std::string, std::string, unsigned>> GetDescription(const HelpParams &params, const unsigned int indent) const override
            {
                std::vector<std::tuple<std::string, std::string, unsigned int>> descriptions;

                // Push that group description on the back if not empty
                unsigned addindent = 0;
                if (!help.empty())
                {
                    descriptions.emplace_back(help, "", indent);
                    addindent = 1;
                }

                for (Base *child: Children())
                {
                    if ((child->GetOptions() & Options::HiddenFromDescription) != Options::None)
                    {
                        continue;
                    }

                    auto groupDescriptions = child->GetDescription(params, indent + addindent);
                    descriptions.insert(
                        std::end(descriptions),
                        std::make_move_iterator(std::begin(groupDescriptions)),
                        std::make_move_iterator(std::end(groupDescriptions)));
                }
                return descriptions;
            }